

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O2

void __thiscall Assimp::ASE::Material::Material(Material *this,Material *other)

{
  D3DS::Material::Material(&this->super_Material,&other->super_Material);
  (this->super_Material)._vptr_Material = (_func_int **)&PTR__Material_007f4bf8;
  (this->avSubMaterials).
  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
  super__Vector_impl_data._M_start =
       (other->avSubMaterials).
       super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->avSubMaterials).
  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (other->avSubMaterials).
       super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->avSubMaterials).
  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (other->avSubMaterials).
       super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (other->avSubMaterials).
  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (other->avSubMaterials).
  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (other->avSubMaterials).
  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->pcInstance = other->pcInstance;
  this->bNeed = other->bNeed;
  other->pcInstance = (aiMaterial *)0x0;
  return;
}

Assistant:

Material(Material &&other) AI_NO_EXCEPT
    : D3DS::Material(std::move(other))
    , avSubMaterials(std::move(other.avSubMaterials))
    , pcInstance(std::move(other.pcInstance))
    , bNeed(std::move(other.bNeed))
    {
        other.pcInstance = nullptr;
    }